

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputContactMessageContent.h
# Opt level: O2

void __thiscall
TgBot::InputContactMessageContent::InputContactMessageContent(InputContactMessageContent *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"InputContactMessageContent",&local_31);
  InputMessageContent::InputMessageContent(&this->super_InputMessageContent,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_InputMessageContent)._vptr_InputMessageContent =
       (_func_int **)&PTR__InputContactMessageContent_002cfa98;
  (this->phoneNumber)._M_dataplus._M_p = (pointer)&(this->phoneNumber).field_2;
  (this->phoneNumber)._M_string_length = 0;
  (this->phoneNumber).field_2._M_local_buf[0] = '\0';
  (this->firstName)._M_dataplus._M_p = (pointer)&(this->firstName).field_2;
  (this->firstName)._M_string_length = 0;
  (this->firstName).field_2._M_local_buf[0] = '\0';
  (this->lastName)._M_dataplus._M_p = (pointer)&(this->lastName).field_2;
  (this->lastName)._M_string_length = 0;
  (this->lastName).field_2._M_local_buf[0] = '\0';
  (this->vcard)._M_dataplus._M_p = (pointer)&(this->vcard).field_2;
  (this->vcard)._M_string_length = 0;
  (this->vcard).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

InputContactMessageContent() :
        InputMessageContent("InputContactMessageContent")
    {}